

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O0

void __thiscall ShellLinkHeader::printHeader(ShellLinkHeader *this)

{
  uint uVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  ShellLinkHeader *local_10;
  ShellLinkHeader *this_local;
  
  local_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "____________________ShellLinkHeader______________________");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"HeaderSize:                         ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,&this->HeaderSize);
  uVar1 = Utils::lenFourBytes(&local_28);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2," bytes");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_28);
  std::operator<<((ostream *)&std::cout,"LinkCLSID:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,&this->LinkCLSID);
  Utils::printSid(&local_50,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"LinkFlags:                          ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,&this->LinkFlags);
  uVar1 = Utils::vectFourBytesToUnsignedInt(&local_68,0);
  parseLinkFlags(this,uVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
  poVar2 = std::operator<<((ostream *)&std::cout,"FileAttributes:                     ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,&this->FileAttributes);
  uVar1 = Utils::vectFourBytesToUnsignedInt(&local_80,0);
  parseFileAttributesFlags(this,uVar1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
  std::operator<<((ostream *)&std::cout,"CreationTime:                       ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_98,&this->CreationTime);
  Utils::getDateFromPos(&local_98,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_98);
  std::operator<<((ostream *)&std::cout,"AccessTime:                         ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b0,&this->AccessTime);
  Utils::getDateFromPos(&local_b0,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b0);
  std::operator<<((ostream *)&std::cout,"WriteTime:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c8,&this->WriteTime);
  Utils::getDateFromPos(&local_c8,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c8);
  poVar2 = std::operator<<((ostream *)&std::cout,"FileSize:                           ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e0,&this->FileSize);
  uVar1 = Utils::lenFourBytes(&local_e0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2," bytes");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
  std::operator<<((ostream *)&std::cout,"IconIndex:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f8,&this->IconIndex);
  Utils::print_vec(&local_f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_f8);
  std::operator<<((ostream *)&std::cout,"ShowCommand:                        ");
  parseShowCommand(this);
  std::operator<<((ostream *)&std::cout,"HotKey:                             ");
  parseHotKeyFlags(this);
  std::operator<<((ostream *)&std::cout,"Reserved1:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_110,&this->Reserved1);
  Utils::print_vec(&local_110);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_110);
  std::operator<<((ostream *)&std::cout,"Reserved2:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_128,&this->Reserved2);
  Utils::print_vec(&local_128);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_128);
  std::operator<<((ostream *)&std::cout,"Reserved3:                          ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_140,&this->Reserved3);
  Utils::print_vec(&local_140);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_140);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ShellLinkHeader::printHeader(){
        cout << "____________________ShellLinkHeader______________________" << endl;
        cout << "HeaderSize:                         " << dec << Utils::lenFourBytes(HeaderSize) << " bytes" << endl;
        cout << "LinkCLSID:                          "; Utils::printSid(LinkCLSID, 0); cout << endl;
        cout << "LinkFlags:                          " << endl;
            ShellLinkHeader::parseLinkFlags(Utils::vectFourBytesToUnsignedInt(LinkFlags,0));
        cout << "FileAttributes:                     " << endl;
            ShellLinkHeader::parseFileAttributesFlags(Utils::vectFourBytesToUnsignedInt(FileAttributes,0));
        cout << "CreationTime:                       "; Utils::getDateFromPos(CreationTime, 0);
        cout << "AccessTime:                         "; Utils::getDateFromPos(AccessTime, 0);
        cout << "WriteTime:                          "; Utils::getDateFromPos(WriteTime, 0);
        cout << "FileSize:                           " << dec << Utils::lenFourBytes(FileSize) << " bytes" << endl;
        cout << "IconIndex:                          "; Utils::print_vec(IconIndex);
        cout << "ShowCommand:                        "; ShellLinkHeader::parseShowCommand();
        cout << "HotKey:                             "; ShellLinkHeader::parseHotKeyFlags();
        cout << "Reserved1:                          "; Utils::print_vec(Reserved1);
        cout << "Reserved2:                          "; Utils::print_vec(Reserved2);
        cout << "Reserved3:                          "; Utils::print_vec(Reserved3);
        cout << "_________________________________________________________" << endl;
    }